

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

NormalBlockISEInputs *
tcu::astc::anon_unknown_0::generateDefaultISEInputs
          (NormalBlockISEInputs *__return_storage_ptr__,NormalBlockParams *blockParams)

{
  bool bVar1;
  byte bVar2;
  deUint32 dVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ISEParams local_30;
  
  (__return_storage_ptr__->weight).isGivenInBlockForm = false;
  iVar8 = blockParams->weightGridHeight * blockParams->weightGridWidth;
  bVar1 = blockParams->isDualPlane;
  bVar2 = bVar1 & 0x1f;
  uVar9 = iVar8 << bVar2;
  dVar3 = computeISERangeMax(&blockParams->weightISEParams);
  iVar4 = uVar9 - 1;
  uVar10 = (long)iVar4 / 2;
  uVar5 = uVar10 & 0xffffffff;
  if (bVar1 == false) {
    uVar6 = 0;
    uVar10 = (ulong)uVar9;
    if (iVar8 << bVar2 < 1) {
      uVar10 = uVar6;
    }
    for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      *(int *)((long)&(__return_storage_ptr__->weight).value + uVar6 * 4) = (int)uVar5 / iVar4;
      uVar5 = (ulong)((int)uVar5 + dVar3);
    }
  }
  else {
    uVar5 = uVar10 & 0xffffffff;
    for (lVar7 = 0; lVar7 < (int)uVar9; lVar7 = lVar7 + 2) {
      *(int *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 4) = (int)uVar5 / iVar4;
      uVar5 = (ulong)((int)uVar5 + dVar3 * 2);
    }
    iVar8 = (int)uVar10 + dVar3;
    for (lVar7 = 1; lVar7 < (int)uVar9; lVar7 = lVar7 + 2) {
      *(deUint32 *)((long)&(__return_storage_ptr__->weight).value + lVar7 * 4) =
           dVar3 - iVar8 / iVar4;
      iVar8 = iVar8 + dVar3 * 2;
    }
  }
  (__return_storage_ptr__->endpoint).isGivenInBlockForm = false;
  uVar9 = computeNumColorEndpointValues
                    (blockParams->colorEndpointModes,blockParams->numPartitions,
                     blockParams->isMultiPartSingleCemMode);
  iVar4 = computeNumBitsForColorEndpoints(blockParams);
  local_30 = computeMaximumRangeISEParams(iVar4,uVar9);
  dVar3 = computeISERangeMax(&local_30);
  uVar5 = (long)(int)(uVar9 - 1) / 2 & 0xffffffff;
  uVar6 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar6;
  }
  for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
    *(int *)((long)&(__return_storage_ptr__->endpoint).value + uVar6 * 4) =
         (int)uVar5 / (int)(uVar9 - 1);
    uVar5 = (ulong)((int)uVar5 + dVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static NormalBlockISEInputs generateDefaultISEInputs (const NormalBlockParams& blockParams)
{
	NormalBlockISEInputs result;

	{
		result.weight.isGivenInBlockForm = false;

		const int numWeights		= computeNumWeights(blockParams);
		const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

		if (blockParams.isDualPlane)
		{
			for (int i = 0; i < numWeights; i += 2)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);

			for (int i = 1; i < numWeights; i += 2)
				result.weight.value.plain[i] = weightRangeMax - (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
		else
		{
			for (int i = 0; i < numWeights; i++)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
	}

	{
		result.endpoint.isGivenInBlockForm = false;

		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);
		const int			colorEndpointRangeMax		= computeISERangeMax(colorEndpointISEParams);

		for (int i = 0; i < numColorEndpointValues; i++)
			result.endpoint.value.plain[i] = (i*colorEndpointRangeMax + (numColorEndpointValues-1)/2) / (numColorEndpointValues-1);
	}

	return result;
}